

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_zip_open(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_vfs *pjVar2;
  jx9_vfs *pVfs;
  sxi32 rc;
  int nLen;
  void *pHandle;
  SyBlob *pContents;
  char *zFile;
  zip_raw_data *pRaw;
  SyArchive *pArchive;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting a file path");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    pContents = (SyBlob *)jx9_value_to_string((jx9_value *)pStream->zName,(int *)((long)&pVfs + 4));
    pArchive = (SyArchive *)jx9VmGetStreamDevice(pjStack_18->pVm,(char **)&pContents,pVfs._4_4_);
    if ((jx9_io_stream *)pArchive == (jx9_io_stream *)0x0) {
      jx9_context_throw_error(pjStack_18,2,"No such stream device, JX9 is returning FALSE");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      pRaw = (zip_raw_data *)jx9_context_alloc_chunk(pjStack_18,0x80,1,0);
      if ((SyArchive *)pRaw == (SyArchive *)0x0) {
        jx9_context_throw_error(pjStack_18,2,"JX9 is running out of memory");
        jx9_result_bool(pjStack_18,0);
      }
      else {
        zFile = (char *)((long)pRaw + 0x58);
        SyArchiveInit((SyArchive *)pRaw,&pjStack_18->pVm->sAllocator,(ProcHash)0x0,
                      (ProcRawStrCmp)0x0);
        if (((((jx9_io_stream *)pArchive == pjStack_18->pVm->pDefStream) &&
             (pjVar2 = jx9ExportBuiltinVfs(), pjVar2 != (jx9_vfs *)0x0)) &&
            (pjVar2->xMmap != (_func_int_char_ptr_void_ptr_ptr_jx9_int64_ptr *)0x0)) &&
           (pVfs._0_4_ = (*pjVar2->xMmap)((char *)pContents,(void **)(zFile + 8),
                                          (jx9_int64 *)(zFile + 0x10)), (int)pVfs == 0)) {
          pVfs._0_4_ = SyZipExtractFromBuf((SyArchive *)pRaw,*(char **)(zFile + 8),
                                           (sxu32)*(undefined8 *)(zFile + 0x10));
          if ((int)pVfs != 0) {
            if (pjVar2->xUnmap != (_func_void_void_ptr_jx9_int64 *)0x0) {
              (*pjVar2->xUnmap)(*(void **)(zFile + 8),*(jx9_int64 *)(zFile + 0x10));
            }
            jx9_context_free_chunk(pjStack_18,pRaw);
            jx9_result_bool(pjStack_18,0);
            return 0;
          }
          zFile[0] = '\x01';
          zFile[1] = '\0';
          zFile[2] = '\0';
          zFile[3] = '\0';
          *(jx9_vfs **)(zFile + 0x18) = pjVar2;
          pVfs._0_4_ = 0;
        }
        else {
          _rc = jx9StreamOpenHandle(pjStack_18->pVm,(jx9_io_stream *)pArchive,(char *)pContents,1,0,
                                    (jx9_value *)0x0,0,(int *)0x0);
          if (_rc == (void *)0x0) {
            jx9_context_throw_error_format(pjStack_18,1,"IO error while opening \'%s\'",pContents);
            jx9_result_bool(pjStack_18,0);
            return 0;
          }
          pHandle = zFile + 8;
          SyBlobInit((SyBlob *)pHandle,&pjStack_18->pVm->sAllocator);
          jx9StreamReadWholeFile(_rc,(jx9_io_stream *)pArchive,(SyBlob *)pHandle);
          pVfs._0_4_ = -9;
          if (*(int *)((long)pHandle + 0x10) != 0) {
            pVfs._0_4_ = SyZipExtractFromBuf((SyArchive *)pRaw,*(char **)((long)pHandle + 8),
                                             *(sxu32 *)((long)pHandle + 0x10));
          }
          zFile[0] = '\x02';
          zFile[1] = '\0';
          zFile[2] = '\0';
          zFile[3] = '\0';
          jx9StreamCloseHandle((jx9_io_stream *)pArchive,_rc);
          if ((int)pVfs != 0) {
            SyBlobRelease((SyBlob *)pHandle);
            jx9_context_free_chunk(pjStack_18,pRaw);
            jx9_result_bool(pjStack_18,0);
            return 0;
          }
        }
        SyArchiveResetLoopCursor((SyArchive *)pRaw);
        jx9_result_resource(pjStack_18,pRaw);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_zip_open(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	SyArchive *pArchive;
	zip_raw_data *pRaw;
	const char *zFile;
	SyBlob *pContents;
	void *pHandle;
	int nLen;
	sxi32 rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Create an in-memory archive */
	pArchive = (SyArchive *)jx9_context_alloc_chunk(pCtx, sizeof(SyArchive)+sizeof(zip_raw_data), TRUE, FALSE);
	if( pArchive == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pRaw = (zip_raw_data *)&pArchive[1];
	/* Initialize the archive */
	SyArchiveInit(pArchive, &pCtx->pVm->sAllocator, 0, 0);
	/* Extract the default stream */
	if( pStream == pCtx->pVm->pDefStream /* file:// stream*/){
		const jx9_vfs *pVfs;
		/* Try to get a memory view of the whole file since ZIP files
		 * tends to be very big this days, this is a huge performance win.
		 */
		pVfs = jx9ExportBuiltinVfs();
		if( pVfs && pVfs->xMmap ){
			rc = pVfs->xMmap(zFile, &pRaw->raw.mmap.pMap, &pRaw->raw.mmap.nSize);
			if( rc == JX9_OK ){
				/* Nice, Extract the whole archive */
				rc = SyZipExtractFromBuf(pArchive, (const char *)pRaw->raw.mmap.pMap, (sxu32)pRaw->raw.mmap.nSize);
				if( rc != SXRET_OK ){
					if( pVfs->xUnmap ){
						pVfs->xUnmap(pRaw->raw.mmap.pMap, pRaw->raw.mmap.nSize);
					}
					/* Release the allocated chunk */
					jx9_context_free_chunk(pCtx, pArchive);
					/* Something goes wrong with this ZIP archive, return FALSE */
					jx9_result_bool(pCtx, 0);
					return JX9_OK;
				}
				/* Archive successfully opened */
				pRaw->iType = ZIP_RAW_DATA_MMAPED;
				pRaw->raw.mmap.pVfs = pVfs;
				goto success;
			}
		}
		/* FALL THROUGH */
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, FALSE, 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pContents = &pRaw->raw.sBlob;
	SyBlobInit(pContents, &pCtx->pVm->sAllocator);
	/* Read the whole file */
	jx9StreamReadWholeFile(pHandle, pStream, pContents);
	/* Assume an invalid ZIP file */
	rc = SXERR_INVALID;
	if( SyBlobLength(pContents) > 0 ){
		/* Extract archive entries */
		rc = SyZipExtractFromBuf(pArchive, (const char *)SyBlobData(pContents), SyBlobLength(pContents));
	}
	pRaw->iType = ZIP_RAW_DATA_MEMBUF;
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	if( rc != SXRET_OK ){
		/* Release the working buffer */
		SyBlobRelease(pContents);
		/* Release the allocated chunk */
		jx9_context_free_chunk(pCtx, pArchive);
		/* Something goes wrong with this ZIP archive, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
success:
	/* Reset the loop cursor */
	SyArchiveResetLoopCursor(pArchive);
	/* Return the in-memory archive as a resource handle */
	jx9_result_resource(pCtx, pArchive);
	return JX9_OK;
}